

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__linear_attenuation
          (ColladaParserAutoGen15Private *this)

{
  ParserChar **buffer;
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined1 uVar3;
  bool failed;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  buffer = &(this->
            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
            ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  GeneratedSaxParser::Utils::toFloat
            (buffer,(this->
                    super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                    ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&local_21);
  if (local_21 == false) {
    iVar2 = (*((this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).mImpl)->_vptr_ColladaParserAutoGen15[0x5ee])();
    uVar3 = (undefined1)iVar2;
  }
  else {
    bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                       ERROR_TEXTDATA_PARSING_FAILED,0x4d05f1e,(ParserChar *)0x0,
                       (this->
                       super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                       ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
    uVar3 = !bVar1;
  }
  if (*buffer != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *buffer = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar3;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__linear_attenuation()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__linear_attenuation();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
float parameter = GeneratedSaxParser::Utils::toFloat((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__linear_attenuation(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_LINEAR_ATTENUATION, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}